

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O1

LY_ERR yin_parse_element_generic(lysp_yin_ctx *ctx,ly_stmt parent_stmt,lysp_stmt **element)

{
  byte *pbVar1;
  LYXML_PARSER_STATUS LVar2;
  uint uVar3;
  lyxml_ctx *plVar4;
  int iVar5;
  LY_ERR LVar6;
  ly_stmt current_element;
  ly_stmt lVar7;
  lysp_stmt *plVar8;
  size_t sVar9;
  char *pcVar10;
  ly_ctx *plVar11;
  yin_argument arg_type;
  char *pcVar12;
  lysp_stmt *plVar13;
  lysp_stmt **pplVar14;
  char **arg_val;
  char *id;
  ly_ctx *local_48;
  lysp_stmt *local_40;
  char *local_38;
  
  local_40 = (lysp_stmt *)0x0;
  if (ctx->xmlctx->status != LYXML_ELEMENT) {
    __assert_fail("ctx->xmlctx->status == LYXML_ELEMENT",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                  ,0xc9e,
                  "LY_ERR yin_parse_element_generic(struct lysp_yin_ctx *, enum ly_stmt, struct lysp_stmt **)"
                 );
  }
  plVar8 = (lysp_stmt *)calloc(1,0x38);
  *element = plVar8;
  plVar4 = ctx->xmlctx;
  if (plVar8 == (lysp_stmt *)0x0) {
    plVar11 = plVar4->ctx;
LAB_00185854:
    ly_log(plVar11,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_element_generic");
    return LY_EMEM;
  }
  if ((plVar4->field_4).prefix_len == 0) {
    LVar6 = lydict_insert(plVar4->ctx,(plVar4->field_5).name,(plVar4->field_6).name_len,
                          (char **)plVar8);
  }
  else {
    iVar5 = asprintf(&local_38,"%.*s:%.*s",(plVar4->field_4).prefix_len,(plVar4->field_3).prefix,
                     (plVar4->field_6).name_len,(plVar4->field_5).name);
    plVar11 = ctx->xmlctx->ctx;
    if (iVar5 == -1) goto LAB_00185854;
    LVar6 = lydict_insert_zc(plVar11,local_38,&(*element)->stmt);
    if (LVar6 != LY_SUCCESS) {
      return LVar6;
    }
    plVar4 = ctx->xmlctx;
    plVar11 = plVar4->ctx;
    plVar8 = *element;
    pcVar12 = plVar8->stmt;
    sVar9 = strlen(pcVar12);
    LVar6 = ly_store_prefix_data
                      (plVar11,pcVar12,sVar9,LY_VALUE_XML,&plVar4->ns,&plVar8->format,
                       &plVar8->prefix_data);
  }
  if (LVar6 != LY_SUCCESS) {
    return LVar6;
  }
  plVar4 = ctx->xmlctx;
  current_element =
       yin_match_keyword(ctx,(plVar4->field_5).name,(plVar4->field_6).name_len,
                         (plVar4->field_3).prefix,(plVar4->field_4).prefix_len,parent_stmt);
  plVar8 = *element;
  plVar8->kw = current_element;
  plVar13 = plVar8->child;
  if (current_element == LY_STMT_EXTENSION_INSTANCE) {
    LVar6 = lyxml_ctx_next(ctx->xmlctx);
    if (LVar6 != LY_SUCCESS) {
      return LVar6;
    }
    plVar4 = ctx->xmlctx;
    LVar2 = plVar4->status;
    plVar8 = local_40;
    while (LVar2 == LYXML_ATTRIBUTE) {
      plVar8 = (lysp_stmt *)calloc(1,0x38);
      if (plVar8 == (lysp_stmt *)0x0) {
        plVar11 = plVar4->ctx;
        local_40 = (lysp_stmt *)0x0;
        goto LAB_00185854;
      }
      pplVar14 = &plVar13->next;
      if ((*element)->child == (lysp_stmt *)0x0) {
        pplVar14 = &(*element)->child;
      }
      *pplVar14 = plVar8;
      pbVar1 = (byte *)((long)&plVar8->flags + 1);
      *pbVar1 = *pbVar1 | 4;
      LVar6 = lydict_insert(plVar4->ctx,(plVar4->field_5).name,(plVar4->field_6).name_len,
                            (char **)plVar8);
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
      plVar8->kw = LY_STMT_NONE;
      pcVar12 = (ctx->xmlctx->field_3).prefix;
      LVar6 = lyxml_ctx_next(ctx->xmlctx);
      if (pcVar12 == (char *)0x0) {
        if (LVar6 != LY_SUCCESS) {
          return LVar6;
        }
        plVar4 = ctx->xmlctx;
        if ((plVar4->field_6).dynamic == '\0') {
          pcVar12 = "";
          if ((plVar4->field_4).prefix_len != 0) {
            pcVar12 = (plVar4->field_3).prefix;
          }
          LVar6 = lydict_insert(plVar4->ctx,pcVar12,(plVar4->field_4).prefix_len,&plVar8->arg);
        }
        else {
          LVar6 = lydict_insert_zc(plVar4->ctx,(plVar4->field_3).prefix,&plVar8->arg);
        }
        if (LVar6 != LY_SUCCESS) {
          return LVar6;
        }
        (ctx->xmlctx->field_6).dynamic = '\0';
        if (plVar8->arg == (char *)0x0) {
          return LY_EMEM;
        }
      }
      else if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
      LVar6 = lyxml_ctx_next(ctx->xmlctx);
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
      plVar4 = ctx->xmlctx;
      plVar13 = plVar8;
      LVar2 = plVar4->status;
    }
    goto LAB_00186146;
  }
  if (current_element == LY_STMT_NONE) {
    if (ctx == (lysp_yin_ctx *)0x0) {
      plVar11 = (ly_ctx *)0x0;
    }
    else {
      plVar11 = (ly_ctx *)
                **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    uVar3 = *(uint *)&ctx->xmlctx->field_6;
    pcVar12 = (ctx->xmlctx->field_5).name;
    pcVar10 = lyplg_ext_stmt2str(parent_stmt);
    ly_vlog(plVar11,(char *)0x0,LYVE_SYNTAX_YIN,"Unexpected sub-element \"%.*s\" of \"%s\" element."
            ,(ulong)uVar3,pcVar12,pcVar10);
    return LY_EVALID;
  }
  LVar6 = lyxml_ctx_next(ctx->xmlctx);
  if (LVar6 != LY_SUCCESS) goto LAB_0018613e;
  arg_val = &plVar8->arg;
  if ((int)current_element < 0x140000) {
    if (0x1ffff < (int)current_element) {
      if ((int)current_element < 0xa0000) {
        if ((int)current_element < 0x60000) {
          if ((int)current_element < 0x40000) {
            if (current_element != LY_STMT_BASE) {
              if (current_element == LY_STMT_BELONGS_TO) goto LAB_00185cbd;
              goto switchD_00185d2d_caseD_3;
            }
          }
          else if (current_element != LY_STMT_BIT) {
            if (current_element == LY_STMT_CONFIG) goto LAB_00186113;
            goto switchD_00185d2d_caseD_3;
          }
          goto switchD_00185d2d_caseD_1;
        }
        if ((int)current_element < 0x80000) {
          if (current_element == LY_STMT_CONTACT) {
LAB_0018600c:
            LVar6 = yin_parse_attribute(ctx,YIN_ARG_NONE,arg_val,Y_MAYBE_STR_ARG,current_element);
            if (LVar6 == LY_SUCCESS) {
              plVar4 = ctx->xmlctx;
              if (plVar4->status != LYXML_ELEM_CONTENT) {
                __assert_fail("ctx->xmlctx->status == LYXML_ELEM_CONTENT",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                              ,0xc65,
                              "LY_ERR yin_parse_extension_instance_arg(struct lysp_yin_ctx *, enum ly_stmt, const char **)"
                             );
              }
              if (((plVar4->field_5).ws_only == '\0') ||
                 (LVar6 = lyxml_ctx_next(plVar4), LVar6 == LY_SUCCESS)) {
                plVar4 = ctx->xmlctx;
                if (plVar4->status == LYXML_ELEMENT) {
                  lVar7 = yin_match_keyword(ctx,(plVar4->field_5).name,(plVar4->field_6).name_len,
                                            (plVar4->field_3).prefix,(plVar4->field_4).prefix_len,
                                            current_element);
                  if (((current_element != LY_STMT_ERROR_MESSAGE) || (lVar7 == LY_STMT_ARG_VALUE))
                     && ((current_element == LY_STMT_ERROR_MESSAGE || (lVar7 == LY_STMT_ARG_TEXT))))
                  {
                    LVar6 = lyxml_ctx_next(ctx->xmlctx);
                    if (LVar6 == LY_SUCCESS) {
                      while (plVar4 = ctx->xmlctx, plVar4->status == LYXML_ATTRIBUTE) {
                        LVar6 = lyxml_ctx_next(plVar4);
                        if ((LVar6 != LY_SUCCESS) ||
                           (LVar6 = lyxml_ctx_next(ctx->xmlctx), LVar6 != LY_SUCCESS))
                        goto LAB_0018613e;
                      }
                      if ((plVar4->field_6).dynamic == '\0') {
                        if ((plVar4->field_4).prefix_len == 0) {
                          pcVar12 = "";
                        }
                        else {
                          pcVar12 = (plVar4->field_3).prefix;
                        }
                        LVar6 = lydict_insert(plVar4->ctx,pcVar12,(plVar4->field_4).prefix_len,
                                              arg_val);
                      }
                      else {
                        LVar6 = lydict_insert_zc(plVar4->ctx,(plVar4->field_3).prefix,arg_val);
                      }
                      if (LVar6 == LY_SUCCESS) {
                        (ctx->xmlctx->field_6).dynamic = '\0';
                        if (*arg_val != (char *)0x0) {
                          LVar6 = lyxml_ctx_next(ctx->xmlctx);
                          goto joined_r0x0018646a;
                        }
                        LVar6 = LY_EMEM;
                      }
                    }
                    goto LAB_0018613e;
                  }
                  if (ctx == (lysp_yin_ctx *)0x0) {
                    local_48 = (ly_ctx *)0x0;
                  }
                  else {
                    local_48 = (ly_ctx *)
                               **(undefined8 **)
                                 (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  }
                  uVar3 = *(uint *)&ctx->xmlctx->field_6;
                  pcVar12 = (ctx->xmlctx->field_5).name;
                  pcVar10 = lyplg_ext_stmt2str(current_element);
                  ly_vlog(local_48,(char *)0x0,LYVE_SYNTAX_YIN,
                          "Unexpected sub-element \"%.*s\" of \"%s\" element.",(ulong)uVar3,pcVar12,
                          pcVar10);
                }
                else {
                  if (ctx == (lysp_yin_ctx *)0x0) {
                    plVar11 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar11 = (ly_ctx *)
                              **(undefined8 **)
                                (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  }
                  pcVar12 = "text";
                  if (current_element == LY_STMT_ERROR_MESSAGE) {
                    pcVar12 = "value";
                  }
                  pcVar10 = lyplg_ext_stmt2str(current_element);
                  ly_vlog(plVar11,(char *)0x0,LYVE_SYNTAX_YIN,
                          "Sub-element \"%s\" of \"%s\" element must be defined as it\'s first sub-element."
                          ,pcVar12,pcVar10);
                }
                LVar6 = LY_EVALID;
              }
            }
            goto LAB_0018613e;
          }
          if (current_element == LY_STMT_DEFAULT) goto LAB_00186113;
        }
        else {
          if (current_element == LY_STMT_DESCRIPTION) goto LAB_0018600c;
          if (current_element == LY_STMT_DEVIATE) goto LAB_00186113;
        }
      }
      else {
        if (0xdffff < (int)current_element) {
          if ((int)current_element < 0x110000) {
            if ((current_element != LY_STMT_EXTENSION) && (current_element != LY_STMT_FEATURE))
            goto switchD_00185d2d_caseD_3;
          }
          else {
            if (current_element == LY_STMT_FRACTION_DIGITS) goto LAB_00186113;
            if ((current_element != LY_STMT_IDENTITY) && (current_element != LY_STMT_IF_FEATURE))
            goto switchD_00185d2d_caseD_3;
          }
          goto switchD_00185d2d_caseD_1;
        }
        if ((int)current_element < 0xc0000) {
          if (current_element == LY_STMT_DEVIATION) goto LAB_00185f6c;
          if (current_element == LY_STMT_ENUM) goto switchD_00185d2d_caseD_1;
        }
        else {
          if (current_element == LY_STMT_ERROR_APP_TAG) goto LAB_00186113;
          if (current_element == LY_STMT_ERROR_MESSAGE) goto LAB_0018600c;
        }
      }
      goto switchD_00185d2d_caseD_3;
    }
    if ((int)current_element < 0x200) {
      if ((int)current_element < 0x10) {
        switch(current_element) {
        case LY_STMT_NOTIFICATION:
        case LY_STMT_ACTION:
          goto switchD_00185d2d_caseD_1;
        case LY_STMT_INPUT:
        case LY_STMT_OUTPUT:
          arg_type = YIN_ARG_NONE;
          goto LAB_00186130;
        default:
          goto switchD_00185d2d_caseD_3;
        }
      }
      if ((0x30 < current_element - LY_STMT_RPC) ||
         ((0x1000000010001U >> ((ulong)(current_element - LY_STMT_RPC) & 0x3f) & 1) == 0)) {
        if (current_element == LY_STMT_AUGMENT) {
LAB_00185f6c:
          arg_type = YIN_ARG_TARGET_NODE;
          goto LAB_00186130;
        }
        if (current_element != LY_STMT_CASE) goto switchD_00185d2d_caseD_3;
      }
      goto switchD_00185d2d_caseD_1;
    }
    if ((int)current_element < 0x2000) {
      if ((int)current_element < 0x800) {
        if ((current_element != LY_STMT_CHOICE) && (current_element != LY_STMT_CONTAINER))
        goto switchD_00185d2d_caseD_3;
      }
      else if ((current_element != LY_STMT_GROUPING) && (current_element != LY_STMT_LEAF))
      goto switchD_00185d2d_caseD_3;
    }
    else if ((int)current_element < 0x8000) {
      if ((current_element != LY_STMT_LEAF_LIST) && (current_element != LY_STMT_LIST))
      goto switchD_00185d2d_caseD_3;
    }
    else if ((current_element != LY_STMT_USES) && (current_element != LY_STMT_ARGUMENT))
    goto switchD_00185d2d_caseD_3;
switchD_00185d2d_caseD_1:
    arg_type = YIN_ARG_NAME;
LAB_00186130:
    LVar6 = yin_parse_attribute(ctx,arg_type,arg_val,Y_MAYBE_STR_ARG,current_element);
joined_r0x0018646a:
    if (LVar6 == LY_SUCCESS) {
      LVar6 = LY_SUCCESS;
    }
  }
  else {
    if ((int)current_element < 0x250000) {
      if ((int)current_element < 0x1c0000) {
        if ((int)current_element < 0x180000) {
          if ((int)current_element < 0x160000) {
            if ((current_element == LY_STMT_IMPORT) || (current_element == LY_STMT_INCLUDE)) {
LAB_00185cbd:
              arg_type = YIN_ARG_MODULE;
              goto LAB_00186130;
            }
          }
          else if ((current_element == LY_STMT_KEY) || (current_element == LY_STMT_LENGTH))
          goto LAB_00186113;
        }
        else if ((int)current_element < 0x1a0000) {
          if ((current_element == LY_STMT_MANDATORY) || (current_element == LY_STMT_MAX_ELEMENTS)) {
LAB_00186113:
            arg_type = YIN_ARG_VALUE;
            goto LAB_00186130;
          }
        }
        else if ((current_element == LY_STMT_MIN_ELEMENTS) || (current_element == LY_STMT_MODIFIER))
        goto LAB_00186113;
      }
      else if ((int)current_element < 0x200000) {
        if ((int)current_element < 0x1e0000) {
          if (current_element == LY_STMT_MODULE) goto switchD_00185d2d_caseD_1;
          if (current_element == LY_STMT_MUST) goto LAB_00185d63;
        }
        else {
          if (current_element == LY_STMT_NAMESPACE) {
            arg_type = YIN_ARG_URI;
            current_element = LY_STMT_NAMESPACE;
            goto LAB_00186130;
          }
          if (current_element == LY_STMT_ORDERED_BY) goto LAB_00186113;
        }
      }
      else if ((int)current_element < 0x220000) {
        if (current_element == LY_STMT_ORGANIZATION) goto LAB_0018600c;
        if (current_element == LY_STMT_PATH) goto LAB_00186113;
      }
      else if (((current_element == LY_STMT_PATTERN) || (current_element == LY_STMT_POSITION)) ||
              (current_element == LY_STMT_PREFIX)) goto LAB_00186113;
    }
    else {
      if ((int)current_element < 0x2d0000) {
        if ((int)current_element < 0x290000) {
          if ((int)current_element < 0x270000) {
            if ((current_element == LY_STMT_PRESENCE) || (current_element == LY_STMT_RANGE))
            goto LAB_00186113;
          }
          else {
            if (current_element == LY_STMT_REFERENCE) goto LAB_0018600c;
            if (current_element == LY_STMT_REFINE) goto LAB_00185f6c;
          }
          goto switchD_00185d2d_caseD_3;
        }
        if ((int)current_element < 0x2b0000) {
          if (current_element != LY_STMT_REQUIRE_INSTANCE) {
            if (current_element != LY_STMT_REVISION) goto switchD_00185d2d_caseD_3;
LAB_00186277:
            arg_type = YIN_ARG_DATE;
            goto LAB_00186130;
          }
        }
        else {
          if (current_element == LY_STMT_REVISION_DATE) goto LAB_00186277;
          if (current_element != LY_STMT_STATUS) goto switchD_00185d2d_caseD_3;
        }
        goto LAB_00186113;
      }
      if ((int)current_element < 0x310000) {
        if ((int)current_element < 0x2f0000) {
          if ((current_element != LY_STMT_SUBMODULE) && (current_element != LY_STMT_TYPE))
          goto switchD_00185d2d_caseD_3;
        }
        else if (current_element != LY_STMT_TYPEDEF) {
          if (current_element == LY_STMT_UNIQUE) {
            arg_type = YIN_ARG_TAG;
            current_element = LY_STMT_UNIQUE;
            goto LAB_00186130;
          }
          goto switchD_00185d2d_caseD_3;
        }
        goto switchD_00185d2d_caseD_1;
      }
      if ((int)current_element < 0x330000) {
        if (current_element == LY_STMT_UNITS) goto switchD_00185d2d_caseD_1;
        if (current_element == LY_STMT_VALUE) goto LAB_00186113;
      }
      else {
        if (current_element == LY_STMT_WHEN) {
LAB_00185d63:
          arg_type = YIN_ARG_CONDITION;
          goto LAB_00186130;
        }
        if ((current_element == LY_STMT_YANG_VERSION) || (current_element == LY_STMT_YIN_ELEMENT))
        goto LAB_00186113;
      }
    }
switchD_00185d2d_caseD_3:
    LVar6 = LY_EINT;
    ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c",
           0xc88);
  }
LAB_0018613e:
  plVar8 = local_40;
  if (LVar6 != LY_SUCCESS) {
    return LVar6;
  }
LAB_00186146:
  local_40 = plVar8;
  plVar4 = ctx->xmlctx;
  if ((plVar4->status != LYXML_ELEM_CONTENT) || ((plVar4->field_5).ws_only != '\0')) {
    LVar6 = lyxml_ctx_next(plVar4);
    if (LVar6 != LY_SUCCESS) {
      return LVar6;
    }
    while( true ) {
      if (ctx->xmlctx->status != LYXML_ELEMENT) {
        return LY_SUCCESS;
      }
      LVar6 = yin_parse_element_generic(ctx,(*element)->kw,&local_40);
      plVar8 = local_40;
      if (LVar6 != LY_SUCCESS) break;
      pplVar14 = &plVar13->next;
      if ((*element)->child == (lysp_stmt *)0x0) {
        pplVar14 = &(*element)->child;
      }
      *pplVar14 = local_40;
      if (ctx->xmlctx->status != LYXML_ELEM_CLOSE) {
        __assert_fail("ctx->xmlctx->status == LYXML_ELEM_CLOSE",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                      ,0xcf0,
                      "LY_ERR yin_parse_element_generic(struct lysp_yin_ctx *, enum ly_stmt, struct lysp_stmt **)"
                     );
      }
      LVar6 = lyxml_ctx_next(ctx->xmlctx);
      plVar13 = plVar8;
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
    }
    return LVar6;
  }
  if ((plVar4->field_4).prefix_len != 0) {
    if ((plVar4->field_6).dynamic == '\0') {
      LVar6 = lydict_insert(plVar4->ctx,(plVar4->field_3).prefix,(plVar4->field_4).prefix_len,
                            &(*element)->arg);
    }
    else {
      LVar6 = lydict_insert_zc(plVar4->ctx,(plVar4->field_3).prefix,&(*element)->arg);
    }
    if (LVar6 != LY_SUCCESS) {
      return LVar6;
    }
    (ctx->xmlctx->field_6).dynamic = '\0';
    plVar8 = *element;
    pcVar12 = plVar8->arg;
    if (pcVar12 == (char *)0x0) {
      return LY_EMEM;
    }
    plVar4 = ctx->xmlctx;
    plVar11 = plVar4->ctx;
    sVar9 = strlen(pcVar12);
    LVar6 = ly_store_prefix_data
                      (plVar11,pcVar12,sVar9,LY_VALUE_XML,&plVar4->ns,&plVar8->format,
                       &plVar8->prefix_data);
    if (LVar6 != LY_SUCCESS) {
      return LVar6;
    }
  }
  LVar6 = lyxml_ctx_next(ctx->xmlctx);
  return LVar6;
}

Assistant:

LY_ERR
yin_parse_element_generic(struct lysp_yin_ctx *ctx, enum ly_stmt parent_stmt, struct lysp_stmt **element)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_stmt *last = NULL, *new = NULL;
    char *id;

    assert(ctx->xmlctx->status == LYXML_ELEMENT);

    /* allocate new structure for element */
    *element = calloc(1, sizeof(**element));
    LY_CHECK_ERR_GOTO(!(*element), LOGMEM(ctx->xmlctx->ctx); ret = LY_EMEM, cleanup);

    /* store identifier */
    if (ctx->xmlctx->prefix_len) {
        if (asprintf(&id, "%.*s:%.*s", (int)ctx->xmlctx->prefix_len, ctx->xmlctx->prefix, (int)ctx->xmlctx->name_len,
                ctx->xmlctx->name) == -1) {
            LOGMEM(ctx->xmlctx->ctx);
            ret = LY_EMEM;
            goto cleanup;
        }
        LY_CHECK_GOTO(ret = lydict_insert_zc(ctx->xmlctx->ctx, id, &(*element)->stmt), cleanup);

        /* store prefix data for the statement */
        LY_CHECK_GOTO(ret = ly_store_prefix_data(ctx->xmlctx->ctx, (*element)->stmt, strlen((*element)->stmt), LY_VALUE_XML,
                &ctx->xmlctx->ns, &(*element)->format, &(*element)->prefix_data), cleanup);
    } else {
        LY_CHECK_GOTO(ret = lydict_insert(ctx->xmlctx->ctx, ctx->xmlctx->name, ctx->xmlctx->name_len, &(*element)->stmt), cleanup);
    }

    (*element)->kw = yin_match_keyword(ctx, ctx->xmlctx->name, ctx->xmlctx->name_len, ctx->xmlctx->prefix,
            ctx->xmlctx->prefix_len, parent_stmt);

    last = (*element)->child;
    if ((*element)->kw == LY_STMT_NONE) {
        /* unrecognized element */
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_UNEXP_SUBELEM, (int)ctx->xmlctx->name_len, ctx->xmlctx->name,
                lyplg_ext_stmt2str(parent_stmt));
        ret = LY_EVALID;
        goto cleanup;
    } else if ((*element)->kw != LY_STMT_EXTENSION_INSTANCE) {
        /* element is known yang keyword, which means argument can be parsed correctly. */
        ret = yin_parse_extension_instance_arg(ctx, (*element)->kw, &(*element)->arg);
        LY_CHECK_GOTO(ret, cleanup);
    } else {
        LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);

        /* load attributes in generic way, save all attributes in linked list */
        while (ctx->xmlctx->status == LYXML_ATTRIBUTE) {
            new = calloc(1, sizeof(*last));
            LY_CHECK_ERR_GOTO(!new, LOGMEM(ctx->xmlctx->ctx); ret = LY_EMEM, cleanup);
            if (!(*element)->child) {
                /* save first */
                (*element)->child = new;
            } else {
                last->next = new;
            }
            last = new;

            last->flags |= LYS_YIN_ATTR;
            LY_CHECK_GOTO(ret = lydict_insert(ctx->xmlctx->ctx, ctx->xmlctx->name, ctx->xmlctx->name_len, &last->stmt), cleanup);
            last->kw = LY_STMT_NONE;
            /* attributes with prefix are ignored */
            if (!ctx->xmlctx->prefix) {
                LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);

                INSERT_STRING_RET(ctx->xmlctx->ctx, ctx->xmlctx->value, ctx->xmlctx->value_len, ctx->xmlctx->dynamic, last->arg);
                LY_CHECK_ERR_GOTO(!last->arg, ret = LY_EMEM, cleanup);
            } else {
                LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
            }
            LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
        }
    }

    if ((ctx->xmlctx->status != LYXML_ELEM_CONTENT) || ctx->xmlctx->ws_only) {
        LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
        while (ctx->xmlctx->status == LYXML_ELEMENT) {
            /* parse subelements */
            ret = yin_parse_element_generic(ctx, (*element)->kw, &new);
            LY_CHECK_GOTO(ret, cleanup);
            if (!(*element)->child) {
                /* save first */
                (*element)->child = new;
            } else {
                last->next = new;
            }
            last = new;

            assert(ctx->xmlctx->status == LYXML_ELEM_CLOSE);
            LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
        }
    } else {
        /* save element content */
        if (ctx->xmlctx->value_len) {
            INSERT_STRING_RET(ctx->xmlctx->ctx, ctx->xmlctx->value, ctx->xmlctx->value_len, ctx->xmlctx->dynamic, (*element)->arg);
            LY_CHECK_ERR_GOTO(!(*element)->arg, ret = LY_EMEM, cleanup);

            /* store prefix data for the argument as well */
            LY_CHECK_GOTO(ret = ly_store_prefix_data(ctx->xmlctx->ctx, (*element)->arg, strlen((*element)->arg), LY_VALUE_XML,
                    &ctx->xmlctx->ns, &(*element)->format, &(*element)->prefix_data), cleanup);
        }

        /* read closing tag */
        LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
    }

cleanup:
    return ret;
}